

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
i2p::sam::Session::StreamAccept(Session *this)

{
  Sock *sock;
  int iVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *request;
  pointer *__ptr;
  Session *in_RSI;
  long in_FS_OFFSET;
  string local_f0;
  string local_d0;
  Reply local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Hello(this);
  sock = (Sock *)(this->m_private_key_file).super_path._M_pathname._M_dataplus._M_p;
  tinyformat::format<std::__cxx11::string>
            (&local_d0,(tinyformat *)"STREAM ACCEPT ID=%s SILENT=false",
             (char *)&in_RSI->m_session_id,in_RCX);
  request = &local_d0;
  SendRequestAndGetReply(&local_b0,in_RSI,sock,request,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"RESULT","");
  Reply::Get(&local_d0,&local_b0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_d0,"OK");
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_b0.keys._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.request._M_dataplus._M_p != &local_b0.request.field_2) {
      operator_delete(local_b0.request._M_dataplus._M_p,
                      local_b0.request.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.full._M_dataplus._M_p != &local_b0.full.field_2) {
      operator_delete(local_b0.full._M_dataplus._M_p,local_b0.full.field_2._M_allocated_capacity + 1
                     );
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
    }
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_d0,"INVALID_ID");
    if (iVar1 == 0) {
      Disconnect(in_RSI);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_f0,(tinyformat *)0x82c0b0,(char *)&local_b0,request);
    std::runtime_error::runtime_error(this_00,(string *)&local_f0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Session::StreamAccept()
{
    auto sock = Hello();

    const Reply& reply = SendRequestAndGetReply(
        *sock, strprintf("STREAM ACCEPT ID=%s SILENT=false", m_session_id), false);

    const std::string& result = reply.Get("RESULT");

    if (result == "OK") {
        return sock;
    }

    if (result == "INVALID_ID") {
        // If our session id is invalid, then force session re-creation on next usage.
        Disconnect();
    }

    throw std::runtime_error(strprintf("\"%s\"", reply.full));
}